

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbePmaReadBlob(PmaReader *p,int nByte,u8 **ppOut)

{
  long lVar1;
  int iVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  long *in_RDX;
  int in_ESI;
  long *in_RDI;
  long in_FS_OFFSET;
  int nCopy;
  int rc_1;
  sqlite3_int64 nNew;
  u8 *aNew;
  int nRem;
  int rc;
  int nRead;
  int nAvail;
  int iBuf;
  u8 *aNext;
  i64 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  void *pOld;
  undefined4 in_stack_ffffffffffffffa0;
  int iVar6;
  undefined4 in_stack_ffffffffffffffa4;
  int local_44;
  undefined4 in_stack_ffffffffffffffd8;
  int local_14;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI[8] == 0) {
    iVar2 = (int)(*in_RDI % (long)(int)in_RDI[7]);
    if ((iVar2 != 0) ||
       (local_14 = sqlite3OsRead((sqlite3_file *)
                                 CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                 in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                                 in_stack_ffffffffffffff88), local_14 == 0)) {
      iVar3 = (int)in_RDI[7] - iVar2;
      if (iVar3 < in_ESI) {
        if ((int)in_RDI[2] < in_ESI) {
          lVar5 = (long)(int)in_RDI[2] * 2;
          if (lVar5 == 0x80 || SBORROW8(0x80,lVar5) != (long)(int)in_RDI[2] * -2 + 0x80 < 0) {
            pOld = (void *)((long)(int)in_RDI[2] << 1);
          }
          else {
            pOld = (void *)0x80;
          }
          for (; (long)pOld < (long)in_ESI; pOld = (void *)((long)pOld << 1)) {
          }
          pvVar4 = sqlite3Realloc(pOld,CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)
                                 );
          if (pvVar4 == (void *)0x0) {
            local_14 = 7;
            goto LAB_0019b81a;
          }
          *(int *)(in_RDI + 2) = (int)pOld;
          in_RDI[4] = (long)pvVar4;
        }
        memcpy((void *)in_RDI[4],(void *)(in_RDI[6] + (long)iVar2),(long)iVar3);
        *in_RDI = (long)iVar3 + *in_RDI;
        for (local_44 = in_ESI - iVar3; 0 < local_44; local_44 = local_44 - iVar6) {
          iVar6 = local_44;
          if ((int)in_RDI[7] < local_44) {
            iVar6 = (int)in_RDI[7];
          }
          local_14 = vdbePmaReadBlob((PmaReader *)CONCAT44(in_ESI,in_stack_ffffffffffffffd8),
                                     (int)((ulong)in_RDX >> 0x20),(u8 **)CONCAT44(iVar2,iVar3));
          if (local_14 != 0) goto LAB_0019b81a;
          memcpy((void *)(in_RDI[4] + (long)(in_ESI - local_44)),(void *)0x0,(long)iVar6);
        }
        *in_RDX = in_RDI[4];
      }
      else {
        *in_RDX = in_RDI[6] + (long)iVar2;
        *in_RDI = (long)in_ESI + *in_RDI;
      }
      local_14 = 0;
    }
  }
  else {
    *in_RDX = in_RDI[8] + *in_RDI;
    *in_RDI = (long)in_ESI + *in_RDI;
    local_14 = 0;
  }
LAB_0019b81a:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_14;
  }
  __stack_chk_fail();
}

Assistant:

static int vdbePmaReadBlob(
  PmaReader *p,                   /* PmaReader from which to take the blob */
  int nByte,                      /* Bytes of data to read */
  u8 **ppOut                      /* OUT: Pointer to buffer containing data */
){
  int iBuf;                       /* Offset within buffer to read from */
  int nAvail;                     /* Bytes of data available in buffer */

  if( p->aMap ){
    *ppOut = &p->aMap[p->iReadOff];
    p->iReadOff += nByte;
    return SQLITE_OK;
  }

  assert( p->aBuffer );

  /* If there is no more data to be read from the buffer, read the next
  ** p->nBuffer bytes of data from the file into it. Or, if there are less
  ** than p->nBuffer bytes remaining in the PMA, read all remaining data.  */
  iBuf = p->iReadOff % p->nBuffer;
  if( iBuf==0 ){
    int nRead;                    /* Bytes to read from disk */
    int rc;                       /* sqlite3OsRead() return code */

    /* Determine how many bytes of data to read. */
    if( (p->iEof - p->iReadOff) > (i64)p->nBuffer ){
      nRead = p->nBuffer;
    }else{
      nRead = (int)(p->iEof - p->iReadOff);
    }
    assert( nRead>0 );

    /* Readr data from the file. Return early if an error occurs. */
    rc = sqlite3OsRead(p->pFd, p->aBuffer, nRead, p->iReadOff);
    assert( rc!=SQLITE_IOERR_SHORT_READ );
    if( rc!=SQLITE_OK ) return rc;
  }
  nAvail = p->nBuffer - iBuf;

  if( nByte<=nAvail ){
    /* The requested data is available in the in-memory buffer. In this
    ** case there is no need to make a copy of the data, just return a
    ** pointer into the buffer to the caller.  */
    *ppOut = &p->aBuffer[iBuf];
    p->iReadOff += nByte;
  }else{
    /* The requested data is not all available in the in-memory buffer.
    ** In this case, allocate space at p->aAlloc[] to copy the requested
    ** range into. Then return a copy of pointer p->aAlloc to the caller.  */
    int nRem;                     /* Bytes remaining to copy */

    /* Extend the p->aAlloc[] allocation if required. */
    if( p->nAlloc<nByte ){
      u8 *aNew;
      sqlite3_int64 nNew = MAX(128, 2*(sqlite3_int64)p->nAlloc);
      while( nByte>nNew ) nNew = nNew*2;
      aNew = sqlite3Realloc(p->aAlloc, nNew);
      if( !aNew ) return SQLITE_NOMEM_BKPT;
      p->nAlloc = nNew;
      p->aAlloc = aNew;
    }

    /* Copy as much data as is available in the buffer into the start of
    ** p->aAlloc[].  */
    memcpy(p->aAlloc, &p->aBuffer[iBuf], nAvail);
    p->iReadOff += nAvail;
    nRem = nByte - nAvail;

    /* The following loop copies up to p->nBuffer bytes per iteration into
    ** the p->aAlloc[] buffer.  */
    while( nRem>0 ){
      int rc;                     /* vdbePmaReadBlob() return code */
      int nCopy;                  /* Number of bytes to copy */
      u8 *aNext = 0;              /* Pointer to buffer to copy data from */

      nCopy = nRem;
      if( nRem>p->nBuffer ) nCopy = p->nBuffer;
      rc = vdbePmaReadBlob(p, nCopy, &aNext);
      if( rc!=SQLITE_OK ) return rc;
      assert( aNext!=p->aAlloc );
      assert( aNext!=0 );
      memcpy(&p->aAlloc[nByte - nRem], aNext, nCopy);
      nRem -= nCopy;
    }

    *ppOut = p->aAlloc;
  }

  return SQLITE_OK;
}